

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void collect_init_els(c2m_ctx_t c2m_ctx,decl_t member_decl,type **type_ptr,
                     node_t_conflict initializer,int const_only_p,int top_p)

{
  gen_ctx_conflict *pgVar1;
  decl_t arr_type;
  byte *pbVar2;
  init_object_t obj;
  init_object_t obj_00;
  init_el_t obj_01;
  init_el_t obj_02;
  int iVar3;
  node_t_conflict pnVar4;
  size_t sVar5;
  node_t_conflict pnVar6;
  node_t_conflict pnVar7;
  mir_llong mVar8;
  pos_t pVar9;
  type *local_1e0;
  type *local_1d8;
  node_t_conflict id;
  decl_t el_decl;
  undefined1 local_188 [16];
  anon_union_8_2_e4b0c9a5_for_u local_178;
  int local_16c;
  ulong uStack_168;
  int first_p;
  mir_llong arr_size_val;
  type *curr_type;
  init_object_t local_148;
  init_object_t local_130;
  decl_t local_118;
  init_object_t init_object;
  int ok_p;
  int found_p;
  int addr_p;
  init_el_t init_el;
  symbol_t sym;
  size_t mark;
  mir_llong size_val;
  node_t_conflict value;
  node_t_conflict init;
  node_t_conflict str;
  node_t_conflict curr_des;
  node_t_conflict des_list;
  node_t_conflict literal;
  expr_conflict *cexpr;
  type *type;
  gen_ctx_t_conflict gen_ctx;
  int top_p_local;
  int const_only_p_local;
  node_t_conflict initializer_local;
  type **type_ptr_local;
  decl_t member_decl_local;
  c2m_ctx_t c2m_ctx_local;
  
  pgVar1 = c2m_ctx->gen_ctx;
  arr_type = (decl_t)*type_ptr;
  ok_p = 0;
  pnVar4 = get_compound_literal(initializer,&ok_p);
  gen_ctx._0_4_ = top_p;
  _top_p_local = (type *)initializer;
  if ((((pnVar4 != (node_t_conflict)0x0) && (ok_p == 0)) && (initializer->code != N_STR)) &&
     ((initializer->code != N_STR16 && (initializer->code != N_STR32)))) {
    _top_p_local = (type *)DLIST_node_t_el(&(pnVar4->u).ops,1);
  }
  while( true ) {
    _found_p = c2m_ctx;
    init_el.member_decl = arr_type;
    if ((*(int *)&_top_p_local->pos_node != 0x54) &&
       (((*(int *)&_top_p_local->pos_node != 0xd || (*(type_mode *)&arr_type->scope != TM_ARR)) ||
        (iVar3 = init_compatible_string_p
                           ((node_t_conflict)_top_p_local,
                            ((anon_union_8_5_3fbb1736_for_u *)&(arr_type->decl_spec).align_node)->
                            ptr_type->arr_type), iVar3 == 0)))) {
      if (((((*(int *)&_top_p_local->pos_node != 0xd) && (*(int *)&_top_p_local->pos_node != 0xe))
           && (*(int *)&_top_p_local->pos_node != 0xf)) &&
          ((const_only_p != 0 && (((ulong)_top_p_local->arr_type->pos_node & 1) == 0)))) &&
         (((*(byte *)&_top_p_local->arr_type->pos_node >> 1 & 1) == 0 &&
          ((pnVar4 == (node_t_conflict)0x0 || (ok_p == 0)))))) {
        __assert_fail("initializer->code == N_STR || initializer->code == N_STR16 || initializer->code == N_STR32 || !const_only_p || cexpr->const_p || cexpr->const_addr_p || (literal != NULL && addr_p)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2ccf,
                      "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
      }
      init_el.c2m_ctx = (c2m_ctx_t)VARR_init_el_tlength(pgVar1->init_els);
      init_el.num = get_object_path_offset(c2m_ctx);
      init_el.offset = (mir_size_t)member_decl;
      sVar5 = VARR_init_object_tlength(c2m_ctx->init_object_path);
      if (sVar5 == 0) {
        local_1d8 = (type *)0x0;
      }
      else {
        VARR_init_object_tlast(&local_130,c2m_ctx->init_object_path);
        local_1d8 = local_130.container_type;
      }
      init_el.el_type = local_1d8;
      init_el.container_type = _top_p_local;
      obj_01.num = (mir_size_t)init_el.c2m_ctx;
      obj_01.c2m_ctx = _found_p;
      obj_01.offset = init_el.num;
      obj_01.member_decl = (decl_t)init_el.offset;
      obj_01.el_type = (type *)init_el.member_decl;
      obj_01.container_type = local_1d8;
      obj_01.init = (node_t_conflict)_top_p_local;
      VARR_init_el_tpush(pgVar1->init_els,obj_01);
      return;
    }
    value = DLIST_node_t_head((DLIST_node_t *)&_top_p_local->align);
    init = (node_t_conflict)_top_p_local;
    if (((((*(int *)&_top_p_local->pos_node == 0xd) || (*(int *)&_top_p_local->pos_node == 0xe)) ||
         (*(int *)&_top_p_local->pos_node == 0xf)) ||
        ((((value != (node_t_conflict)0x0 && (value->code == N_INIT)) &&
          (((pnVar6 = DLIST_node_t_el((DLIST_node_t *)&_top_p_local->align,1),
            pnVar6 == (node_t_conflict)0x0 &&
            ((pnVar6 = DLIST_node_t_head(&(value->u).ops), pnVar6->code == N_LIST &&
             (pnVar6 = DLIST_node_t_head(&(pnVar6->u).ops), pnVar6 == (node_t_conflict)0x0)))) &&
           (pnVar6 = DLIST_node_t_el(&(value->u).ops,1), pnVar6 != (node_t_conflict)0x0)))) &&
         (((init = DLIST_node_t_el(&(value->u).ops,1), init->code == N_STR ||
           (init->code == N_STR16)) || (init->code == N_STR32)))))) &&
       ((*(type_mode *)&arr_type->scope == TM_ARR &&
        (iVar3 = init_compatible_string_p
                           (init,((anon_union_8_5_3fbb1736_for_u *)&(arr_type->decl_spec).align_node
                                 )->ptr_type->arr_type), iVar3 != 0)))) {
      init_el.c2m_ctx = (c2m_ctx_t)VARR_init_el_tlength(pgVar1->init_els);
      init_el.num = get_object_path_offset(c2m_ctx);
      init_el.offset = 0;
      sVar5 = VARR_init_object_tlength(c2m_ctx->init_object_path);
      if (sVar5 == 0) {
        local_1e0 = (type *)0x0;
      }
      else {
        VARR_init_object_tlast(&local_148,c2m_ctx->init_object_path);
        local_1e0 = local_148.container_type;
      }
      init_el.el_type = local_1e0;
      init_el.container_type = (type *)init;
      obj_02.num = (mir_size_t)init_el.c2m_ctx;
      obj_02.c2m_ctx = _found_p;
      obj_02.offset = init_el.num;
      obj_02.member_decl = (decl_t)init_el.offset;
      obj_02.el_type = (type *)init_el.member_decl;
      obj_02.container_type = local_1e0;
      obj_02.init = init;
      VARR_init_el_tpush(pgVar1->init_els,obj_02);
      return;
    }
    if (value == (node_t_conflict)0x0) {
      return;
    }
    if (value->code != N_INIT) {
      __assert_fail("init->code == N_INIT",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2cf2,
                    "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
    }
    pnVar6 = DLIST_node_t_head(&(value->u).ops);
    if (pnVar6->code != N_LIST) {
      __assert_fail("des_list->code == N_LIST",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2cf4,
                    "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
    }
    if (((*(type_mode *)&arr_type->scope == TM_ARR) || (*(type_mode *)&arr_type->scope == TM_STRUCT)
        ) || (*(type_mode *)&arr_type->scope == TM_UNION)) break;
    pnVar7 = DLIST_node_t_next(value);
    if ((pnVar7 != (node_t_conflict)0x0) ||
       (pnVar7 = DLIST_node_t_head(&(pnVar6->u).ops), pnVar7 != (node_t_conflict)0x0)) {
      __assert_fail("NL_NEXT (init) == NULL && NL_HEAD (des_list->u.ops) == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2cf6,
                    "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
    }
    _top_p_local = (type *)DLIST_node_t_next(pnVar6);
    if ((int)gen_ctx == 0) {
      __assert_fail("top_p",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2cf8,
                    "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
    }
    gen_ctx._0_4_ = 0;
  }
  sVar5 = VARR_init_object_tlength(c2m_ctx->init_object_path);
  init_object.container_type = (type *)((ulong)init_object.container_type._4_4_ << 0x20);
  local_118 = arr_type;
  if (*(type_mode *)&arr_type->scope == TM_ARR) {
    mVar8 = get_arr_type_size((type *)arr_type);
    if (mVar8 < 0) {
      __assert_fail("size_val >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2d02,
                    "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
    }
    init_object.field_designator_p = -1;
    init_object._12_4_ = 0xffffffff;
  }
  else {
    init_object.field_designator_p = 0;
    init_object._12_4_ = 0;
  }
  obj._8_8_ = init_object.container_type;
  obj.container_type = (type *)local_118;
  obj.u = (anon_union_8_2_e4b0c9a5_for_u)init_object._8_8_;
  VARR_init_object_tpush(c2m_ctx->init_object_path,obj);
  do {
    if (value == (node_t_conflict)0x0) {
      VARR_init_object_ttrunc(c2m_ctx->init_object_path,sVar5);
      return;
    }
    if (value->code != N_INIT) {
      __assert_fail("init->code == N_INIT",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2d09,
                    "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
    }
    pnVar4 = DLIST_node_t_head(&(value->u).ops);
    pnVar6 = DLIST_node_t_next(pnVar4);
    if ((((pnVar6->code == N_LIST) || (pnVar6->code == N_COMPOUND_LITERAL)) &&
        (*(type_mode *)&arr_type->scope != TM_ARR)) &&
       ((*(type_mode *)&arr_type->scope != TM_STRUCT && (*(type_mode *)&arr_type->scope != TM_UNION)
        ))) {
      __assert_fail("(value->code != N_LIST && value->code != N_COMPOUND_LITERAL) || type->mode == TM_ARR || type->mode == TM_STRUCT || type->mode == TM_UNION"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2d0d,
                    "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
    }
    str = DLIST_node_t_head(&(pnVar4->u).ops);
    if (str == (node_t_conflict)0x0) {
      _curr_type = get_node_pos(c2m_ctx,value);
      init_object.u.curr_index._4_4_ =
           update_path_and_do(c2m_ctx,1,collect_init_els,sVar5,pnVar6,const_only_p,(mir_llong *)0x0,
                              _curr_type,"");
      if (init_object.u.curr_index._4_4_ == 0) {
        __assert_fail("ok_p",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2d11,
                      "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
      }
    }
    else {
      local_16c = 1;
      arr_size_val = (mir_llong)arr_type;
      VARR_init_object_ttrunc(c2m_ctx->init_object_path,sVar5 + 1);
      while (str != (node_t_conflict)0x0) {
        VARR_init_object_tlast((init_object_t *)local_188,c2m_ctx->init_object_path);
        local_118 = (decl_t)local_188._0_8_;
        init_object.container_type = (type *)local_188._8_8_;
        init_object._8_8_ = local_178;
        if (local_16c == 0) {
          if (*(type_mode *)(local_188._0_8_ + 0x18) == TM_ARR) {
            arr_size_val = (mir_llong)
                           ((anon_union_8_5_3fbb1736_for_u *)
                           &((decl_spec *)(local_188._0_8_ + 0x28))->align_node)->tag_type->attr;
          }
          else {
            if ((*(type_mode *)(local_188._0_8_ + 0x18) != TM_STRUCT) &&
               (*(type_mode *)(local_188._0_8_ + 0x18) != TM_UNION)) {
              __assert_fail("init_object.container_type->mode == TM_STRUCT || init_object.container_type->mode == TM_UNION"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                            ,0x2d21,
                            "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                           );
            }
            arr_size_val = *(mir_llong *)((long)(local_178.curr_member)->attr + 0x40);
          }
        }
        else {
          VARR_init_object_tpop((init_object_t *)&el_decl,c2m_ctx->init_object_path);
        }
        if (str->code == N_FIELD_ID) {
          pnVar4 = DLIST_node_t_head(&(str->u).ops);
          if ((*(int *)(arr_size_val + 0x18) != 4) && (*(int *)(arr_size_val + 0x18) != 5)) {
            __assert_fail("curr_type->mode == TM_STRUCT || curr_type->mode == TM_UNION",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0x2d2a,
                          "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                         );
          }
          iVar3 = symbol_find(c2m_ctx,S_REGULAR,pnVar4,*(node_t_conflict *)(arr_size_val + 0x30),
                              (symbol_t *)&init_el.init);
          if (iVar3 == 0) {
            __assert_fail("found_p",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0x2d2c,
                          "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                         );
          }
          process_init_field_designator(c2m_ctx,sym.scope,(type *)arr_size_val);
          pnVar4 = DLIST_node_t_next(str);
          pVar9 = get_node_pos(c2m_ctx,value);
          init_object.u.curr_index._4_4_ =
               update_path_and_do(c2m_ctx,(uint)(pnVar4 == (node_t_conflict)0x0),collect_init_els,
                                  sVar5,pnVar6,const_only_p,(mir_llong *)0x0,pVar9,"");
          if (init_object.u.curr_index._4_4_ == 0) {
            __assert_fail("ok_p",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0x2d30,
                          "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                         );
          }
        }
        else {
          pbVar2 = (byte *)str->attr;
          if (((((*(int *)(arr_size_val + 0x18) != 6) || ((*pbVar2 & 1) == 0)) ||
               (iVar3 = integer_type_p(*(type **)(pbVar2 + 0x18)), iVar3 == 0)) ||
              ((iVar3 = incomplete_type_p(c2m_ctx,(type *)arr_size_val), iVar3 != 0 ||
               (uStack_168 = get_arr_type_size((type *)arr_size_val), (long)uStack_168 < 0)))) ||
             (uStack_168 <= *(ulong *)(pbVar2 + 0x30))) {
            __assert_fail("curr_type->mode == TM_ARR && cexpr->const_p && integer_type_p (cexpr->type) && !incomplete_type_p (c2m_ctx, curr_type) && (arr_size_val = get_arr_type_size (curr_type)) >= 0 && (mir_ullong) arr_size_val > cexpr->c.u_val"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0x2d37,
                          "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                         );
          }
          init_object._8_8_ = *(long *)(pbVar2 + 0x30) + -1;
          init_object.container_type =
               (type *)((ulong)init_object.container_type & 0xffffffff00000000);
          local_118 = (decl_t)arr_size_val;
          obj_00._8_8_ = init_object.container_type;
          obj_00.container_type = (type *)arr_size_val;
          obj_00.u.curr_member = (node_t_conflict)init_object._8_8_;
          VARR_init_object_tpush(c2m_ctx->init_object_path,obj_00);
          pnVar4 = DLIST_node_t_next(str);
          pVar9 = get_node_pos(c2m_ctx,value);
          init_object.u.curr_index._4_4_ =
               update_path_and_do(c2m_ctx,(uint)(pnVar4 == (node_t_conflict)0x0),collect_init_els,
                                  sVar5,pnVar6,const_only_p,(mir_llong *)0x0,pVar9,"");
          if (init_object.u.curr_index._4_4_ == 0) {
            __assert_fail("ok_p",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0x2d3e,
                          "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                         );
          }
        }
        str = DLIST_node_t_next(str);
        local_16c = 0;
      }
    }
    value = DLIST_node_t_next(value);
  } while( true );
}

Assistant:

static void collect_init_els (c2m_ctx_t c2m_ctx, decl_t member_decl, struct type **type_ptr,
                              node_t initializer, int const_only_p, int top_p MIR_UNUSED) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  struct type *type = *type_ptr;
  struct expr *cexpr;
  node_t literal, des_list, curr_des, str, init, value;
  mir_llong MIR_UNUSED size_val = 0; /* to remove an uninitialized warning */
  size_t mark;
  symbol_t sym;
  init_el_t init_el;
  int addr_p = FALSE; /* to remove an uninitialized warning */
  int MIR_UNUSED found_p, MIR_UNUSED ok_p;
  init_object_t init_object;

  literal = get_compound_literal (initializer, &addr_p);
  if (literal != NULL && !addr_p && initializer->code != N_STR && initializer->code != N_STR16
      && initializer->code != N_STR32)
    initializer = NL_EL (literal->u.ops, 1);
check_one_value:
  if (initializer->code != N_LIST
      && !(initializer->code == N_STR && type->mode == TM_ARR
           && init_compatible_string_p (initializer, type->u.arr_type->el_type))) {
    cexpr = initializer->attr;
    /* static or thread local object initialization should be const expr or addr: */
    assert (initializer->code == N_STR || initializer->code == N_STR16
            || initializer->code == N_STR32 || !const_only_p || cexpr->const_p
            || cexpr->const_addr_p || (literal != NULL && addr_p));
    init_el.c2m_ctx = c2m_ctx;
    init_el.num = VARR_LENGTH (init_el_t, init_els);
    init_el.offset = get_object_path_offset (c2m_ctx);
    init_el.member_decl = member_decl;
    init_el.el_type = type;
    init_el.container_type = VARR_LENGTH (init_object_t, init_object_path) == 0
                               ? NULL
                               : VARR_LAST (init_object_t, init_object_path).container_type;
    init_el.init = initializer;
    VARR_PUSH (init_el_t, init_els, init_el);
    return;
  }
  init = NL_HEAD (initializer->u.ops);
  if (((str = initializer)->code == N_STR || str->code == N_STR16
       || str->code == N_STR32 /* string or string in parentheses  */
       || (init != NULL && init->code == N_INIT && NL_EL (initializer->u.ops, 1) == NULL
           && (des_list = NL_HEAD (init->u.ops))->code == N_LIST
           && NL_HEAD (des_list->u.ops) == NULL && NL_EL (init->u.ops, 1) != NULL
           && ((str = NL_EL (init->u.ops, 1))->code == N_STR || str->code == N_STR16
               || str->code == N_STR32)))
      && type->mode == TM_ARR && init_compatible_string_p (str, type->u.arr_type->el_type)) {
    init_el.c2m_ctx = c2m_ctx;
    init_el.num = VARR_LENGTH (init_el_t, init_els);
    init_el.offset = get_object_path_offset (c2m_ctx);
    init_el.member_decl = NULL;
    init_el.el_type = type;
    init_el.container_type = VARR_LENGTH (init_object_t, init_object_path) == 0
                               ? NULL
                               : VARR_LAST (init_object_t, init_object_path).container_type;
    init_el.init = str;
    VARR_PUSH (init_el_t, init_els, init_el);
    return;
  }
  if (init == NULL) return;
  assert (init->code == N_INIT);
  des_list = NL_HEAD (init->u.ops);
  assert (des_list->code == N_LIST);
  if (type->mode != TM_ARR && type->mode != TM_STRUCT && type->mode != TM_UNION) {
    assert (NL_NEXT (init) == NULL && NL_HEAD (des_list->u.ops) == NULL);
    initializer = NL_NEXT (des_list);
    assert (top_p);
    top_p = FALSE;
    goto check_one_value;
  }
  mark = VARR_LENGTH (init_object_t, init_object_path);
  init_object.container_type = type;
  init_object.field_designator_p = FALSE;
  if (type->mode == TM_ARR) {
    size_val = get_arr_type_size (type);
    /* we already figured out the array size during check: */
    assert (size_val >= 0);
    init_object.u.curr_index = -1;
  } else {
    init_object.u.curr_member = NULL;
  }
  VARR_PUSH (init_object_t, init_object_path, init_object);
  for (; init != NULL; init = NL_NEXT (init)) {
    assert (init->code == N_INIT);
    des_list = NL_HEAD (init->u.ops);
    value = NL_NEXT (des_list);
    assert ((value->code != N_LIST && value->code != N_COMPOUND_LITERAL) || type->mode == TM_ARR
            || type->mode == TM_STRUCT || type->mode == TM_UNION);
    if ((curr_des = NL_HEAD (des_list->u.ops)) == NULL) {
      ok_p = update_path_and_do (c2m_ctx, TRUE, collect_init_els, mark, value, const_only_p, NULL,
                                 POS (init), "");
      assert (ok_p);
    } else {
      struct type *curr_type = type;
      mir_llong arr_size_val MIR_UNUSED;
      int first_p = TRUE;

      VARR_TRUNC (init_object_t, init_object_path, mark + 1);
      for (; curr_des != NULL; curr_des = NL_NEXT (curr_des), first_p = FALSE) {
        init_object = VARR_LAST (init_object_t, init_object_path);
        if (first_p) {
          VARR_POP (init_object_t, init_object_path);
        } else {
          if (init_object.container_type->mode == TM_ARR) {
            curr_type = init_object.container_type->u.arr_type->el_type;
          } else {
            assert (init_object.container_type->mode == TM_STRUCT
                    || init_object.container_type->mode == TM_UNION);
            decl_t el_decl = init_object.u.curr_member->attr;
            curr_type = el_decl->decl_spec.type;
          }
        }
        if (curr_des->code == N_FIELD_ID) {
          node_t id = NL_HEAD (curr_des->u.ops);

          /* field should be only in struct/union initializer */
          assert (curr_type->mode == TM_STRUCT || curr_type->mode == TM_UNION);
          found_p = symbol_find (c2m_ctx, S_REGULAR, id, curr_type->u.tag_type, &sym);
          assert (found_p); /* field should present */
          process_init_field_designator (c2m_ctx, sym.def_node, curr_type);
          ok_p = update_path_and_do (c2m_ctx, NL_NEXT (curr_des) == NULL, collect_init_els, mark,
                                     value, const_only_p, NULL, POS (init), "");
          assert (ok_p);
        } else {
          cexpr = curr_des->attr;
          /* index should be in array initializer and const expr of right type and value: */
          assert (curr_type->mode == TM_ARR && cexpr->const_p && integer_type_p (cexpr->type)
                  && !incomplete_type_p (c2m_ctx, curr_type)
                  && (arr_size_val = get_arr_type_size (curr_type)) >= 0
                  && (mir_ullong) arr_size_val > cexpr->c.u_val);
          init_object.u.curr_index = cexpr->c.i_val - 1;
          init_object.field_designator_p = FALSE;
          init_object.container_type = curr_type;
          VARR_PUSH (init_object_t, init_object_path, init_object);
          ok_p = update_path_and_do (c2m_ctx, NL_NEXT (curr_des) == NULL, collect_init_els, mark,
                                     value, const_only_p, NULL, POS (init), "");
          assert (ok_p);
        }
      }
    }
  }
  VARR_TRUNC (init_object_t, init_object_path, mark);
}